

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_feature.c
# Opt level: O0

int extractor(light_pcapng packet,void *data,size_t feature_count)

{
  byte bVar1;
  uint16_t *puVar2;
  uint16_t uVar3;
  undefined4 *in_RSI;
  light_pcapng in_RDI;
  uint8_t byte_1;
  uint8_t byte;
  _light_interface_description_block *idb;
  int i;
  uint8_t *octets;
  _light_enhanced_packet_block *epb;
  uint16_t ethernet_type;
  uint8_t ip_header_length;
  uint8_t protocol_version;
  uint32_t type;
  size_t body_size;
  uint32_t *body;
  float *features;
  byte in_stack_ffffffffffffff9f;
  uint8_t *in_stack_ffffffffffffffa0;
  int local_54;
  uint16_t *local_50;
  int local_3c;
  size_t local_38;
  long local_30;
  undefined4 *local_28;
  light_pcapng local_10;
  
  local_30 = 0;
  local_38 = 0;
  local_3c = -0x21524111;
  local_28 = in_RSI;
  local_10 = in_RDI;
  light_get_block_info(in_RDI,LIGHT_INFO_BODY,&local_30,&local_38);
  light_get_block_info(local_10,LIGHT_INFO_TYPE,&local_3c,(size_t *)0x0);
  if (local_3c == 1) {
    print_interface((_light_interface_description_block *)0x1023d0);
  }
  else if (local_3c == 6) {
    local_50 = (uint16_t *)(local_30 + 0x14);
    printf("HWaddr0: ");
    for (local_54 = 0; local_54 < 6; local_54 = local_54 + 1) {
      in_stack_ffffffffffffff9f = (byte)*local_50;
      printf("%x:",(ulong)in_stack_ffffffffffffff9f);
      local_50 = (uint16_t *)((long)local_50 + 1);
    }
    printf("\n");
    printf("HWaddr1: ");
    for (local_54 = 0; local_54 < 6; local_54 = local_54 + 1) {
      printf("%x:",(ulong)(byte)*local_50);
      local_50 = (uint16_t *)((long)local_50 + 1);
    }
    printf("\n");
    uVar3 = ntohs(*local_50);
    puVar2 = local_50 + 1;
    if (uVar3 != 0x800) {
      if (uVar3 == 0x8100) {
        puVar2 = local_50 + 3;
      }
      else if (uVar3 != 0x86dd) {
        if (uVar3 != 0x9100) {
          printf("Unhandled Ethernet type(len) 0x%X\n",(ulong)uVar3);
          return 0;
        }
        puVar2 = local_50 + 4;
      }
    }
    local_50 = puVar2;
    bVar1 = (byte)((int)(uint)(byte)*local_50 >> 4);
    if (bVar1 == 4) {
      __handle_ipv4(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
      *local_28 = 0x3f800000;
    }
    else {
      printf("Protocol version = %u\n",(ulong)bVar1);
    }
    printf("\n");
  }
  return 0;
}

Assistant:

static int extractor(const light_pcapng packet, void *data, size_t feature_count)
{
	float *features = (float *)data;
	uint32_t *body = NULL;
	size_t body_size = 0;
	uint32_t type = LIGHT_UNKNOWN_DATA_BLOCK;
	uint8_t protocol_version;
	uint8_t ip_header_length;
	uint16_t ethernet_type;
	struct _light_enhanced_packet_block *epb;
	uint8_t *octets;
	int i;

	light_get_block_info(packet, LIGHT_INFO_BODY, &body, &body_size);
	light_get_block_info(packet, LIGHT_INFO_TYPE, &type, NULL);

	if (type == LIGHT_INTERFACE_BLOCK) {
		struct _light_interface_description_block *idb = (struct _light_interface_description_block *)body;
		print_interface(idb);
		return 0;
	}
	else if (type != LIGHT_ENHANCED_PACKET_BLOCK /*&& type != LIGHT_SIMPLE_PACKET_BLOCK*/) {
		return 0;
	}

	epb = (struct _light_enhanced_packet_block *)body;
	octets = (uint8_t *)epb->packet_data;

	printf("HWaddr0: "); // Print destination address.
	for (i = 0; i < 6; ++i) {
		uint8_t byte = *octets++;
		printf("%x:", byte);
	}
	printf("\n");

	printf("HWaddr1: "); // Print host address.
	for (i = 0; i < 6; ++i) {
		uint8_t byte = *octets++;
		printf("%x:", byte);
	}
	printf("\n");

	ethernet_type = ntohs(*(uint16_t*)(octets));
	octets += 2; // Skip rest of Ethernet header.

	switch (ethernet_type) {
	case 0x0800: // Internet Protocol v4
	case 0x86DD: // Internet Protocol v6
		break;
	case 0x8100: // 802.1Q Virtual LAN
		octets += 4;
		break;
	case 0x9100: // 802.1Q DoubleTag
		octets += 6;
		break;
	default:
		printf("Unhandled Ethernet type(len) 0x%X\n", ethernet_type);
		return 0;
	}

	ip_header_length = (*octets) & 0b1111;
	protocol_version = (*octets >> 4) & 0b1111;

	if (protocol_version == 4) {
		__handle_ipv4(octets, ip_header_length);
		features[FEATURE_PROTOCOL] = 1.0;
	}
	else {
		// TODO;
		printf("Protocol version = %u\n", protocol_version);
	}

	printf("\n");
	return 0;
}